

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_op<ncnn::reduction_op_sumsq<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  int i_1;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint _w;
  uint uVar16;
  int q_1;
  uint uVar17;
  int q;
  float fVar18;
  Mat sums;
  Mat local_90;
  ulong local_50;
  Mat *local_48;
  size_t local_40;
  void *local_38;
  
  sVar2 = a->elemsize;
  iVar15 = a->dims;
  if (iVar15 == 3) {
    uVar14 = a->w;
    lVar12 = (long)(int)uVar14;
    uVar17 = a->h;
    _w = a->c;
    uVar8 = (ulong)_w;
    uVar16 = uVar17 * uVar14;
    bVar4 = !reduce_h;
    if ((!reduce_w || bVar4) || !reduce_c) {
      if ((reduce_w && !bVar4) && !reduce_c) {
        Mat::create(b,_w,sVar2,opt->blob_allocator);
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        if ((int)_w < 1) {
          uVar8 = 0;
        }
        for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
          Mat::channel(&sums,a,(int)uVar7);
          pvVar5 = sums.data;
          Mat::~Mat(&sums);
          fVar18 = 0.0;
          for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
            fVar1 = *(float *)((long)pvVar5 + uVar10 * 4);
            fVar18 = fVar18 + fVar1 * fVar1;
          }
          *(float *)((long)b->data + uVar7 * 4) = fVar18;
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && !reduce_c) {
        Mat::create(b,uVar17,_w,sVar2,opt->blob_allocator);
        uVar8 = 0;
        if (0 < (int)uVar14) {
          uVar8 = (ulong)uVar14;
        }
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        if ((int)_w < 1) {
          _w = 0;
        }
        local_48 = a;
        for (uVar14 = 0; uVar14 != _w; uVar14 = uVar14 + 1) {
          Mat::channel(&sums,local_48,uVar14);
          pvVar11 = sums.data;
          Mat::~Mat(&sums);
          iVar15 = b->w;
          sVar2 = b->elemsize;
          pvVar5 = b->data;
          for (uVar7 = 0; uVar7 != uVar17; uVar7 = uVar7 + 1) {
            fVar18 = 0.0;
            for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
              fVar1 = *(float *)((long)pvVar11 + uVar10 * 4);
              fVar18 = fVar18 + fVar1 * fVar1;
            }
            *(float *)((long)pvVar5 + uVar7 * 4 + (long)(int)uVar14 * (long)iVar15 * sVar2) = fVar18
            ;
            pvVar11 = (void *)((long)pvVar11 + lVar12 * 4);
          }
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && reduce_c) {
        Mat::create(b,uVar17,sVar2,opt->blob_allocator);
        Mat::Mat(&sums,1,uVar17,_w,sVar2,opt->workspace_allocator);
        iVar15 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          local_48 = a;
          Mat::fill(&sums,0.0);
          uVar10 = 0;
          uVar7 = 0;
          if (0 < (int)uVar14) {
            uVar7 = (ulong)uVar14;
          }
          uVar13 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar13 = uVar10;
          }
          if ((int)_w < 1) {
            uVar8 = uVar10;
          }
          while (uVar10 != uVar8) {
            Mat::channel(&local_90,local_48,(int)uVar10);
            pvVar5 = local_90.data;
            Mat::~Mat(&local_90);
            pvVar11 = (void *)(sums.cstep * uVar10 * sums.elemsize + (long)sums.data);
            local_90.refcount = (int *)0x0;
            local_90.elemsize = sums.elemsize;
            local_90.elempack = sums.elempack;
            local_90.allocator = sums.allocator;
            local_90.dims = 2;
            local_90.w = sums.w;
            local_90.h = sums.h;
            local_90.c = 1;
            local_90.cstep = (size_t)(sums.h * sums.w);
            local_90.data = pvVar11;
            local_50 = uVar10;
            Mat::~Mat(&local_90);
            for (uVar10 = 0; uVar10 != uVar13; uVar10 = uVar10 + 1) {
              fVar18 = 0.0;
              for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
                fVar1 = *(float *)((long)pvVar5 + uVar9 * 4);
                fVar18 = fVar18 + fVar1 * fVar1;
              }
              *(float *)((long)pvVar11 + uVar10 * 4) = fVar18;
              pvVar5 = (void *)((long)pvVar5 + lVar12 * 4);
            }
            uVar10 = local_50 + 1;
          }
          Mat::fill(b,0.0);
          for (uVar7 = 0; sVar3 = sums.cstep, sVar2 = sums.elemsize, pvVar5 = sums.data, iVar15 = 0,
              uVar7 != uVar8; uVar7 = uVar7 + 1) {
            local_90.data = (void *)(sums.cstep * uVar7 * sums.elemsize + (long)sums.data);
            local_90.refcount = (int *)0x0;
            local_90.elemsize = sums.elemsize;
            local_90.elempack = sums.elempack;
            local_90.allocator = sums.allocator;
            local_90.dims = 2;
            local_90.w = sums.w;
            local_90.h = sums.h;
            local_90.c = 1;
            local_90.cstep = (size_t)(sums.h * sums.w);
            Mat::~Mat(&local_90);
            pvVar11 = b->data;
            for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
              *(float *)((long)pvVar11 + uVar10 * 4) =
                   *(float *)((long)pvVar5 + uVar10 * 4 + sVar3 * sVar2 * uVar7) +
                   *(float *)((long)pvVar11 + uVar10 * 4);
            }
          }
        }
      }
      else {
        if ((bVar4 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar14,uVar17,sVar2,opt->blob_allocator);
            Mat::fill(b,0.0);
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            if ((int)_w < 1) {
              _w = 0;
            }
            for (uVar14 = 0; uVar14 != _w; uVar14 = uVar14 + 1) {
              Mat::channel(&sums,a,uVar14);
              pvVar11 = sums.data;
              Mat::~Mat(&sums);
              pvVar5 = b->data;
              for (uVar8 = 0; uVar16 != uVar8; uVar8 = uVar8 + 1) {
                fVar18 = *(float *)((long)pvVar11 + uVar8 * 4);
                *(float *)((long)pvVar5 + uVar8 * 4) =
                     fVar18 * fVar18 + *(float *)((long)pvVar5 + uVar8 * 4);
              }
            }
            return 0;
          }
          if ((!bVar4 && !reduce_w) && !reduce_c) {
            Mat::create(b,uVar14,_w,sVar2,opt->blob_allocator);
            Mat::fill(b,0.0);
            uVar8 = 0;
            if (0 < (int)uVar14) {
              uVar8 = (ulong)uVar14;
            }
            if ((int)uVar17 < 1) {
              uVar17 = 0;
            }
            if ((int)_w < 1) {
              _w = 0;
            }
            for (uVar14 = 0; uVar14 != _w; uVar14 = uVar14 + 1) {
              Mat::channel(&sums,a,uVar14);
              pvVar11 = sums.data;
              Mat::~Mat(&sums);
              lVar6 = (long)(int)(b->w * uVar14) * b->elemsize;
              pvVar5 = b->data;
              for (uVar16 = 0; uVar16 != uVar17; uVar16 = uVar16 + 1) {
                for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
                  fVar18 = *(float *)((long)pvVar11 + uVar7 * 4);
                  *(float *)((long)pvVar5 + uVar7 * 4 + lVar6) =
                       fVar18 * fVar18 + *(float *)((long)pvVar5 + uVar7 * 4 + lVar6);
                }
                pvVar11 = (void *)((long)pvVar11 + lVar12 * 4);
              }
            }
            return 0;
          }
          return 0;
        }
        Mat::create(b,uVar14,sVar2,opt->blob_allocator);
        Mat::Mat(&sums,uVar14,1,_w,sVar2,opt->workspace_allocator);
        iVar15 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar7 = 0;
          uVar10 = 0;
          if (0 < (int)uVar14) {
            uVar10 = (ulong)uVar14;
          }
          if ((int)uVar17 < 1) {
            uVar17 = 0;
          }
          if ((int)_w < 1) {
            uVar8 = uVar7;
          }
          while (uVar7 != uVar8) {
            local_50 = uVar7;
            Mat::channel(&local_90,a,(int)uVar7);
            pvVar5 = local_90.data;
            Mat::~Mat(&local_90);
            sVar2 = sums.cstep;
            local_38 = sums.data;
            local_40 = sums.elemsize;
            local_90.data = (void *)(sums.cstep * local_50 * sums.elemsize + (long)sums.data);
            local_90.refcount = (int *)0x0;
            local_90.elemsize = sums.elemsize;
            local_90.elempack = sums.elempack;
            local_90.allocator = sums.allocator;
            local_90.dims = 2;
            local_90.w = sums.w;
            local_90.h = sums.h;
            local_90.c = 1;
            local_90.cstep = (size_t)(sums.h * sums.w);
            Mat::~Mat(&local_90);
            lVar6 = sVar2 * local_40 * local_50;
            for (uVar14 = 0; uVar14 != uVar17; uVar14 = uVar14 + 1) {
              for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
                fVar18 = *(float *)((long)pvVar5 + uVar7 * 4);
                *(float *)((long)local_38 + uVar7 * 4 + lVar6) =
                     fVar18 * fVar18 + *(float *)((long)local_38 + uVar7 * 4 + lVar6);
              }
              pvVar5 = (void *)((long)pvVar5 + lVar12 * 4);
            }
            uVar7 = local_50 + 1;
          }
          Mat::fill(b,0.0);
          for (uVar7 = 0; sVar3 = sums.cstep, sVar2 = sums.elemsize, pvVar5 = sums.data, iVar15 = 0,
              uVar7 != uVar8; uVar7 = uVar7 + 1) {
            local_90.data = (void *)(sums.cstep * uVar7 * sums.elemsize + (long)sums.data);
            local_90.refcount = (int *)0x0;
            local_90.elemsize = sums.elemsize;
            local_90.elempack = sums.elempack;
            local_90.allocator = sums.allocator;
            local_90.dims = 2;
            local_90.w = sums.w;
            local_90.h = sums.h;
            local_90.c = 1;
            local_90.cstep = (size_t)(sums.h * sums.w);
            Mat::~Mat(&local_90);
            pvVar11 = b->data;
            for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
              *(float *)((long)pvVar11 + uVar13 * 4) =
                   *(float *)((long)pvVar5 + uVar13 * 4 + sVar3 * sVar2 * uVar7) +
                   *(float *)((long)pvVar11 + uVar13 * 4);
            }
          }
        }
      }
      goto LAB_00139a38;
    }
    Mat::create(b,1,sVar2,opt->blob_allocator);
    Mat::Mat(&sums,_w,sVar2,opt->workspace_allocator);
    iVar15 = -100;
    if ((sums.data == (void *)0x0) || ((long)sums.c * sums.cstep == 0)) goto LAB_00139a38;
    uVar10 = 0;
    uVar7 = (ulong)uVar16;
    if ((int)uVar16 < 1) {
      uVar7 = uVar10;
    }
    if ((int)_w < 1) {
      uVar8 = uVar10;
    }
    for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
      Mat::channel(&local_90,a,(int)uVar10);
      pvVar5 = local_90.data;
      Mat::~Mat(&local_90);
      fVar18 = 0.0;
      for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
        fVar1 = *(float *)((long)pvVar5 + uVar13 * 4);
        fVar18 = fVar18 + fVar1 * fVar1;
      }
      *(float *)((long)sums.data + uVar10 * 4) = fVar18;
    }
    fVar18 = 0.0;
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      fVar18 = fVar18 + *(float *)((long)sums.data + uVar7 * 4);
    }
  }
  else {
    if (iVar15 != 2) {
      if (iVar15 == 1) {
        uVar14 = a->w;
        Mat::create(b,1,sVar2,opt->blob_allocator);
        uVar7 = 0;
        uVar8 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar8 = uVar7;
        }
        fVar18 = 0.0;
        for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          fVar1 = *(float *)((long)a->data + uVar7 * 4);
          fVar18 = fVar18 + fVar1 * fVar1;
        }
        *(float *)b->data = fVar18;
        return 0;
      }
      return 0;
    }
    uVar14 = a->w;
    uVar17 = a->h;
    if (!reduce_w || !reduce_h) {
      if (reduce_w && !reduce_h) {
        Mat::create(b,uVar17,sVar2,opt->blob_allocator);
        pvVar5 = a->data;
        uVar8 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar8 = 0;
        }
        iVar15 = a->w;
        uVar7 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar7 = 0;
        }
        pvVar11 = b->data;
        sVar2 = a->elemsize;
        for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
          fVar18 = 0.0;
          for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
            fVar1 = *(float *)((long)pvVar5 + uVar13 * 4);
            fVar18 = fVar18 + fVar1 * fVar1;
          }
          *(float *)((long)pvVar11 + uVar10 * 4) = fVar18;
          pvVar5 = (void *)((long)pvVar5 + (long)iVar15 * sVar2);
        }
        return 0;
      }
      if (reduce_h && !reduce_w) {
        Mat::create(b,uVar14,sVar2,opt->blob_allocator);
        Mat::fill(b,0.0);
        uVar8 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar8 = 0;
        }
        pvVar5 = a->data;
        uVar7 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar7 = 0;
        }
        iVar15 = a->w;
        sVar2 = a->elemsize;
        for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
          pvVar11 = b->data;
          for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
            fVar18 = *(float *)((long)pvVar5 + uVar13 * 4);
            *(float *)((long)pvVar11 + uVar13 * 4) =
                 fVar18 * fVar18 + *(float *)((long)pvVar11 + uVar13 * 4);
          }
          pvVar5 = (void *)((long)pvVar5 + (long)iVar15 * sVar2);
        }
        return 0;
      }
      return 0;
    }
    Mat::create(b,1,sVar2,opt->blob_allocator);
    Mat::Mat(&sums,uVar17,sVar2,opt->workspace_allocator);
    iVar15 = -100;
    if ((sums.data == (void *)0x0) || ((long)sums.c * sums.cstep == 0)) goto LAB_00139a38;
    pvVar5 = a->data;
    iVar15 = a->w;
    uVar7 = 0;
    uVar8 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar8 = uVar7;
    }
    uVar10 = (ulong)uVar17;
    if ((int)uVar17 < 1) {
      uVar10 = uVar7;
    }
    sVar2 = a->elemsize;
    for (; fVar18 = 0.0, uVar7 != uVar10; uVar7 = uVar7 + 1) {
      for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
        fVar1 = *(float *)((long)pvVar5 + uVar13 * 4);
        fVar18 = fVar18 + fVar1 * fVar1;
      }
      *(float *)((long)sums.data + uVar7 * 4) = fVar18;
      pvVar5 = (void *)((long)pvVar5 + (long)iVar15 * sVar2);
    }
    for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      fVar18 = fVar18 + *(float *)((long)sums.data + uVar8 * 4);
    }
  }
  *(float *)b->data = fVar18;
  iVar15 = 0;
LAB_00139a38:
  Mat::~Mat(&sums);
  return iVar15;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;
        
        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> X X
            b.create(1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> X h
            b.create(h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }
            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w X
            b.create(w, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }
            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> X X X
            b.create(1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> X X c
            b.create(channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                b[q] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> X h c
            b.create(h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> X h X
            b.create(h, elemsize, opt.blob_allocator);
            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w X X
            b.create(w, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h X
            b.create(w, h, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w X c
            b.create(w, channels, elemsize, opt.blob_allocator);
            
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }
            return 0;
        }
    }

    return 0;
}